

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Equals * __thiscall Catch::Matchers::Impl::StdString::Equals::toString_abi_cxx11_(Equals *this)

{
  string local_38 [40];
  Equals *this_local;
  
  this_local = this;
  std::operator+((char *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"equals: \"");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

virtual std::string toString() const {
                return "equals: \"" + m_str + "\"";
            }